

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefidump.cpp
# Opt level: O0

USTATUS __thiscall
UEFIDumper::dump(UEFIDumper *this,UByteArray *buffer,CBString *inPath,CBString *guid)

{
  USTATUS UVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  reference this_00;
  ostream *this_01;
  UModelIndex local_340;
  UModelIndex local_328;
  UEFIDumper *local_310;
  USTATUS result;
  size_t i;
  ofstream ofs;
  undefined1 local_100 [8];
  vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> report;
  FfsReport ffsReport;
  USTATUS result_1;
  CBString local_b8;
  undefined1 local_a0 [8];
  CBString reportPath;
  CBString local_78;
  CBString local_60;
  undefined1 local_48 [8];
  CBString path;
  CBString *guid_local;
  CBString *inPath_local;
  UByteArray *buffer_local;
  UEFIDumper *this_local;
  
  path.super_tagbstring.data = (uchar *)guid;
  Bstrlib::CBString::CBString(&local_60,inPath);
  Bstrlib::CBString::CBString(&local_78,".dump");
  Bstrlib::CBString::operator+((CBString *)local_48,&local_60,&local_78);
  Bstrlib::CBString::~CBString(&local_78);
  Bstrlib::CBString::~CBString(&local_60);
  Bstrlib::CBString::CBString(&local_b8,inPath);
  Bstrlib::CBString::CBString((CBString *)&result_1,".report.txt");
  Bstrlib::CBString::operator+((CBString *)local_a0,&local_b8,(CBString *)&result_1);
  Bstrlib::CBString::~CBString((CBString *)&result_1);
  Bstrlib::CBString::~CBString(&local_b8);
  if (((this->initialized & 1U) != 0) &&
     (bVar2 = UByteArray::operator!=(buffer,&this->currentBuffer), bVar2)) {
    this->initialized = false;
  }
  if ((this->initialized & 1U) == 0) {
    UByteArray::operator=(&this->currentBuffer,buffer);
    this_local = (UEFIDumper *)FfsParser::parse(&this->ffsParser,buffer);
    if (this_local != (UEFIDumper *)0x0) goto LAB_00112f0e;
    FfsParser::outputInfo(&this->ffsParser);
    FfsReport::FfsReport
              ((FfsReport *)
               &report.super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&this->model);
    FfsReport::generate((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)local_100,
                        (FfsReport *)
                        &report.
                         super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar3 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::size
                      ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)local_100);
    if (sVar3 != 0) {
      std::ofstream::ofstream(&i);
      pcVar4 = Bstrlib::CBString::operator_cast_to_char_((CBString *)local_a0);
      std::ofstream::open((char *)&i,(_Ios_Openmode)pcVar4);
      for (result = 0; UVar1 = result,
          sVar3 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::size
                            ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)
                             local_100), UVar1 < sVar3; result = result + 1) {
        this_00 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::operator[]
                            ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)
                             local_100,result);
        pcVar4 = Bstrlib::CBString::toLocal8Bit(this_00);
        this_01 = std::operator<<((ostream *)&i,pcVar4);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      }
      std::ofstream::close();
      std::ofstream::~ofstream(&i);
    }
    this->initialized = true;
    std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::~vector
              ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)local_100);
    FfsReport::~FfsReport
              ((FfsReport *)
               &report.super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  bVar2 = isExistOnFs((CBString *)local_48);
  if (bVar2) {
    this_local = (UEFIDumper *)0x22;
  }
  else {
    bVar2 = makeDirectory((CBString *)local_48);
    if (bVar2) {
      bVar2 = changeDirectory((CBString *)local_48);
      if (bVar2) {
        this->dumped = false;
        UModelIndex::UModelIndex(&local_340);
        TreeModel::index((TreeModel *)&local_328,(char *)this,0);
        local_310 = (UEFIDumper *)recursiveDump(this,&local_328);
        this_local = local_310;
        if (local_310 == (UEFIDumper *)0x0) {
          if ((this->dumped & 1U) == 0) {
            this_local = (UEFIDumper *)0x8;
          }
          else {
            this_local = (UEFIDumper *)0x0;
          }
        }
      }
      else {
        this_local = (UEFIDumper *)0x24;
      }
    }
    else {
      this_local = (UEFIDumper *)0x23;
    }
  }
LAB_00112f0e:
  Bstrlib::CBString::~CBString((CBString *)local_a0);
  Bstrlib::CBString::~CBString((CBString *)local_48);
  return (USTATUS)this_local;
}

Assistant:

USTATUS UEFIDumper::dump(const UByteArray & buffer, const UString & inPath, const UString & guid)
{
    UString path = UString(inPath) + UString(".dump");
    UString reportPath = UString(inPath) + UString(".report.txt");

    if (initialized) {
        // Check if called with a different buffer as before
        if (buffer != currentBuffer) {
            // Reinitalize if so
            initialized = false;
        }
    }

    if (!initialized) {
        // Fill currentBuffer
        currentBuffer = buffer;

        // Parse FFS structure
        USTATUS result = ffsParser.parse(buffer);
        if (result)
            return result;

        ffsParser.outputInfo();

        // Create ffsReport
        FfsReport ffsReport(&model);
        std::vector<UString> report = ffsReport.generate();
        if (report.size()) {
            std::ofstream ofs;
            ofs.open(reportPath, std::ofstream::out);
            for (size_t i = 0; i < report.size(); i++) {
                ofs << report[i].toLocal8Bit() << std::endl;
            }
            ofs.close();
        }
        
        initialized = true;
    }
    
    // Check for dump directory existence
    if (isExistOnFs(path))
        return U_DIR_ALREADY_EXIST;

    // Create dump directory and cd to it
    if (!makeDirectory(path))
        return U_DIR_CREATE;

    if (!changeDirectory(path))
        return U_DIR_CHANGE;
    
    dumped = false;
    USTATUS result = recursiveDump(model.index(0,0));
    if (result)
        return result;
    else if (!dumped)
        return U_ITEM_NOT_FOUND;

    return U_SUCCESS;
}